

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_error.cpp
# Opt level: O0

CSVError *
duckdb::CSVError::CastError
          (CSVReaderOptions *options,string *column_name,string *cast_error,idx_t column_idx,
          string *csv_row,LinesPerBoundary error_info,idx_t row_byte_position,
          optional_idx byte_position,LogicalTypeId type,string *current_path)

{
  bool bVar1;
  ostream *poVar2;
  string *in_RCX;
  string *in_RDX;
  CSVError *in_RDI;
  string *in_R9;
  undefined8 in_stack_00000020;
  ostringstream how_to_fix_it;
  ostringstream error;
  undefined8 in_stack_fffffffffffffb38;
  idx_t in_stack_fffffffffffffb40;
  CSVReaderOptions *in_stack_fffffffffffffb48;
  string local_3d0 [32];
  undefined8 local_3b0;
  string local_398 [32];
  string local_378 [32];
  string local_358 [32];
  ostringstream local_338 [184];
  idx_t in_stack_fffffffffffffd80;
  string *in_stack_fffffffffffffd88;
  idx_t in_stack_fffffffffffffd90;
  CSVErrorType in_stack_fffffffffffffd9f;
  string *in_stack_fffffffffffffda0;
  CSVError *in_stack_fffffffffffffda8;
  optional_idx in_stack_fffffffffffffdb0;
  LinesPerBoundary in_stack_fffffffffffffdc0;
  CSVReaderOptions *in_stack_fffffffffffffdd8;
  string *in_stack_fffffffffffffde0;
  string *in_stack_fffffffffffffde8;
  ostringstream local_1b0 [376];
  string *local_38;
  string *local_28;
  string *local_20;
  undefined8 local_10;
  
  local_10 = in_stack_00000020;
  local_38 = in_R9;
  local_28 = in_RCX;
  local_20 = in_RDX;
  ::std::__cxx11::ostringstream::ostringstream(local_1b0);
  poVar2 = ::std::operator<<((ostream *)local_1b0,"Error when converting column \"");
  poVar2 = ::std::operator<<(poVar2,local_20);
  ::std::operator<<(poVar2,"\". ");
  poVar2 = ::std::operator<<((ostream *)local_1b0,local_28);
  ::std::operator<<(poVar2,'\n');
  ::std::__cxx11::ostringstream::ostringstream(local_338);
  poVar2 = ::std::operator<<((ostream *)local_338,"Column ");
  poVar2 = ::std::operator<<(poVar2,local_20);
  poVar2 = ::std::operator<<(poVar2," is being converted as type ");
  LogicalTypeIdToString_abi_cxx11_((LogicalTypeId)((ulong)in_stack_fffffffffffffb38 >> 0x38));
  poVar2 = ::std::operator<<(poVar2,local_358);
  ::std::operator<<(poVar2,'\n');
  ::std::__cxx11::string::~string(local_358);
  bVar1 = CSVReaderOptions::WasTypeManuallySet(in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
  if (bVar1) {
    poVar2 = ::std::operator<<((ostream *)local_338,
                               "This type was either manually set or derived from an existing table. Select a different type to correctly parse this column."
                              );
    ::std::operator<<(poVar2,'\n');
  }
  else {
    poVar2 = ::std::operator<<((ostream *)local_338,"This type was auto-detected from the CSV file."
                              );
    ::std::operator<<(poVar2,'\n');
    poVar2 = ::std::operator<<((ostream *)local_338,"Possible solutions:");
    ::std::operator<<(poVar2,'\n');
    poVar2 = ::std::operator<<((ostream *)local_338,
                               "* Override the type for this column manually by setting the type explicitly, e.g. types={\'"
                              );
    poVar2 = ::std::operator<<(poVar2,local_20);
    poVar2 = ::std::operator<<(poVar2,"\': \'VARCHAR\'}");
    ::std::operator<<(poVar2,'\n');
    poVar2 = ::std::operator<<((ostream *)local_338,
                               "* Set the sample size to a larger value to enable the auto-detection to scan more values, e.g. sample_size=-1"
                              );
    ::std::operator<<(poVar2,'\n');
    poVar2 = ::std::operator<<((ostream *)local_338,
                               "* Use a COPY statement to automatically derive types from an existing table."
                              );
    ::std::operator<<(poVar2,'\n');
  }
  poVar2 = ::std::operator<<((ostream *)local_338,
                             "* Check whether the null string value is set correctly (e.g., nullstr = \'N/A\')"
                            );
  ::std::operator<<(poVar2,'\n');
  ::std::__cxx11::ostringstream::str();
  ::std::__cxx11::string::string(local_398,local_38);
  local_3b0 = local_10;
  ::std::__cxx11::ostringstream::str();
  CSVError(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,in_stack_fffffffffffffd9f,
           in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffdc0,
           in_stack_fffffffffffffd80,in_stack_fffffffffffffdb0,in_stack_fffffffffffffdd8,
           in_stack_fffffffffffffde0,in_stack_fffffffffffffde8);
  ::std::__cxx11::string::~string(local_3d0);
  ::std::__cxx11::string::~string(local_398);
  ::std::__cxx11::string::~string(local_378);
  ::std::__cxx11::ostringstream::~ostringstream(local_338);
  ::std::__cxx11::ostringstream::~ostringstream(local_1b0);
  return in_RDI;
}

Assistant:

CSVError CSVError::CastError(const CSVReaderOptions &options, const string &column_name, string &cast_error,
                             idx_t column_idx, string &csv_row, LinesPerBoundary error_info, idx_t row_byte_position,
                             optional_idx byte_position, LogicalTypeId type, const string &current_path) {
	std::ostringstream error;
	// Which column
	error << "Error when converting column \"" << column_name << "\". ";
	// What was the cast error
	error << cast_error << '\n';
	std::ostringstream how_to_fix_it;
	how_to_fix_it << "Column " << column_name << " is being converted as type " << LogicalTypeIdToString(type) << '\n';
	if (!options.WasTypeManuallySet(column_idx)) {
		how_to_fix_it << "This type was auto-detected from the CSV file." << '\n';
		how_to_fix_it << "Possible solutions:" << '\n';
		how_to_fix_it << "* Override the type for this column manually by setting the type explicitly, e.g. types={'"
		              << column_name << "': 'VARCHAR'}" << '\n';
		how_to_fix_it
		    << "* Set the sample size to a larger value to enable the auto-detection to scan more values, e.g. "
		       "sample_size=-1"
		    << '\n';
		how_to_fix_it << "* Use a COPY statement to automatically derive types from an existing table." << '\n';
	} else {
		how_to_fix_it
		    << "This type was either manually set or derived from an existing table. Select a different type to "
		       "correctly parse this column."
		    << '\n';
	}
	how_to_fix_it << "* Check whether the null string value is set correctly (e.g., nullstr = 'N/A')" << '\n';

	return CSVError(error.str(), CAST_ERROR, column_idx, csv_row, error_info, row_byte_position, byte_position, options,
	                how_to_fix_it.str(), current_path);
}